

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

void sq_pushstring(HSQUIRRELVM v,SQChar *s,SQInteger len)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr local_18;
  
  if (s != (SQChar *)0x0) {
    local_18.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,s,len);
    local_18.super_SQObject._type = OT_STRING;
    pSVar1 = &((local_18.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SQVM::Push(v,&local_18);
    SQObjectPtr::~SQObjectPtr(&local_18);
    return;
  }
  SQVM::PushNull(v);
  return;
}

Assistant:

void sq_pushstring(HSQUIRRELVM v,const SQChar *s,SQInteger len)
{
    if(s)
        v->Push(SQObjectPtr(SQString::Create(_ss(v), s, len)));
    else v->PushNull();
}